

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

int bucket_alloc_pairs(bucket b,size_t capacity)

{
  pair ppVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (b == (bucket)0x0) {
    pcVar3 = "Invalid bucket";
    uVar2 = 0x95;
  }
  else if (b->pairs == (pair)0x0) {
    ppVar1 = (pair)malloc(capacity << 4);
    b->pairs = ppVar1;
    if (ppVar1 != (pair)0x0) {
      b->count = 0;
      b->capacity = capacity;
      return 0;
    }
    pcVar3 = "Bad pairs allocation";
    uVar2 = 0xa3;
  }
  else {
    pcVar3 = "Set bucket pairs already allocated";
    uVar2 = 0x9b;
  }
  log_write_impl_va("metacall",uVar2,"bucket_alloc_pairs",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,3,pcVar3);
  return 1;
}

Assistant:

int bucket_alloc_pairs(bucket b, size_t capacity)
{
	if (b == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket");
		return 1;
	}

	if (b->pairs != NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Set bucket pairs already allocated");
		return 1;
	}

	b->pairs = malloc(sizeof(struct pair_type) * capacity);

	if (b->pairs == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad pairs allocation");
		return 1;
	}

	b->count = 0;
	b->capacity = capacity;

	return 0;
}